

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retArea.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkRetimeMinAreaOne(Abc_Ntk_t *pNtk,int fForward,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  Vec_Ptr_t *vMinCut;
  Abc_Ntk_t *pNtkNew;
  int fVerbose_local;
  int fForward_local;
  Abc_Ntk_t *pNtk_local;
  
  vMinCut = (Vec_Ptr_t *)0x0;
  Abc_NtkRetimeMinAreaPrepare(pNtk,fForward);
  p = Abc_NtkMaxFlow(pNtk,fForward,fVerbose);
  iVar1 = Vec_PtrSize(p);
  iVar2 = Abc_NtkLatchNum(pNtk);
  if (iVar1 < iVar2) {
    vMinCut = (Vec_Ptr_t *)0x1;
    if (fForward == 0) {
      vMinCut = (Vec_Ptr_t *)Abc_NtkRetimeMinAreaConstructNtk(pNtk,p);
    }
    else {
      Abc_NtkRetimeMinAreaInitValues(pNtk,p);
    }
    Abc_NtkRetimeMinAreaUpdateLatches(pNtk,p,fForward);
  }
  Vec_PtrFree(p);
  Abc_NtkCleanMarkA(pNtk);
  return (Abc_Ntk_t *)vMinCut;
}

Assistant:

Abc_Ntk_t * Abc_NtkRetimeMinAreaOne( Abc_Ntk_t * pNtk, int fForward, int fVerbose )
{ 
    Abc_Ntk_t * pNtkNew = NULL;
    Vec_Ptr_t * vMinCut;
    // mark current latches and TFI(POs)
    Abc_NtkRetimeMinAreaPrepare( pNtk, fForward );
    // run the maximum forward flow
    vMinCut = Abc_NtkMaxFlow( pNtk, fForward, fVerbose );
//    assert( Vec_PtrSize(vMinCut) <= Abc_NtkLatchNum(pNtk) );
    // create new latch boundary if there is improvement
    if ( Vec_PtrSize(vMinCut) < Abc_NtkLatchNum(pNtk) )
    {
        pNtkNew = (Abc_Ntk_t *)1;
        if ( fForward )
            Abc_NtkRetimeMinAreaInitValues( pNtk, vMinCut );
        else
            pNtkNew = Abc_NtkRetimeMinAreaConstructNtk( pNtk, vMinCut );
        Abc_NtkRetimeMinAreaUpdateLatches( pNtk, vMinCut, fForward );
    }
    // clean up
    Vec_PtrFree( vMinCut );
    Abc_NtkCleanMarkA( pNtk );
    return pNtkNew;
}